

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O1

void __thiscall jaegertracing::net::URI_testPrint_Test::TestBody(URI_testPrint_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ostringstream oss;
  AssertHelper local_240 [8];
  undefined1 *local_238;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  undefined1 local_228 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 *local_1f8;
  undefined1 local_1e8 [24];
  undefined1 *local_1d0;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  undefined1 local_1a0 [16];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_238 = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"localhost","");
  jaegertracing::net::URI::parse((string *)&local_218);
  URI::print<std::ostream>
            ((URI *)&local_218,(basic_ostream<char,_std::char_traits<char>_> *)local_190);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[59],std::__cxx11::string>
            ((internal *)&local_238,
             "\"{ scheme=\\\"\\\"\" \", host=\\\"\\\"\" \", port=0\" \", path=\\\"localhost\\\"\" \", query=\\\"\\\" }\""
             ,"oss.str()",
             (char (*) [59])"{ scheme=\"\", host=\"\", port=0, path=\"localhost\", query=\"\" }",
             &local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if (local_238._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_218);
    if (local_230.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_230.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_240,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=(local_240,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(local_240);
    if ((long *)local_218._M_dataplus._M_p != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)local_218._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_218._M_dataplus._M_p + 8))();
      }
      local_218._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_230,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

TEST(URI, testPrint)
{
    std::ostringstream oss;
    oss << URI::parse("localhost");
    ASSERT_EQ(
        "{ scheme=\"\""
        ", host=\"\""
        ", port=0"
        ", path=\"localhost\""
        ", query=\"\" }",
        oss.str());
}